

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O1

void __thiscall ezexample::mini_setup_example(ezexample *this)

{
  size_t *psVar1;
  char cVar2;
  char cVar3;
  vw *pvVar4;
  example *peVar5;
  char *pcVar6;
  pointer pbVar7;
  float fVar8;
  
  this->ec->partial_prediction = 0.0;
  fVar8 = (*(this->vw_par_ref->p->lp).get_weight)(&this->ec->l);
  this->ec->weight = fVar8;
  psVar1 = &this->ec->num_features;
  *psVar1 = *psVar1 - this->quadratic_features_num;
  this->ec->total_sum_feat_sq = this->ec->total_sum_feat_sq - this->quadratic_features_sqr;
  this->quadratic_features_num = 0;
  this->quadratic_features_sqr = 0.0;
  pvVar4 = this->vw_ref;
  pbVar7 = (pvVar4->pairs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 != (pvVar4->pairs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    peVar5 = this->ec;
    do {
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      cVar2 = *pcVar6;
      cVar3 = pcVar6[1];
      this->quadratic_features_num =
           this->quadratic_features_num +
           ((long)(peVar5->super_example_predict).feature_space[cVar3].values._end -
            (long)(peVar5->super_example_predict).feature_space[cVar3].values._begin >> 2) *
           ((long)(peVar5->super_example_predict).feature_space[cVar2].values._end -
            (long)(peVar5->super_example_predict).feature_space[cVar2].values._begin >> 2);
      pcVar6 = (pbVar7->_M_dataplus)._M_p;
      this->quadratic_features_sqr =
           (peVar5->super_example_predict).feature_space[*pcVar6].sum_feat_sq *
           (peVar5->super_example_predict).feature_space[pcVar6[1]].sum_feat_sq +
           this->quadratic_features_sqr;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (pvVar4->pairs).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar1 = &this->ec->num_features;
  *psVar1 = *psVar1 + this->quadratic_features_num;
  this->ec->total_sum_feat_sq = this->quadratic_features_sqr + this->ec->total_sum_feat_sq;
  return;
}

Assistant:

void mini_setup_example()
  {
    ec->partial_prediction = 0.;
    ec->weight = vw_par_ref->p->lp.get_weight(&ec->l);

    ec->num_features -= quadratic_features_num;
    ec->total_sum_feat_sq -= quadratic_features_sqr;

    quadratic_features_num = 0;
    quadratic_features_sqr = 0.;

    for (std::vector<std::string>::iterator i = vw_ref->pairs.begin(); i != vw_ref->pairs.end(); i++)
    {
      quadratic_features_num += ec->feature_space[(int)(*i)[0]].size() * ec->feature_space[(int)(*i)[1]].size();
      quadratic_features_sqr +=
          ec->feature_space[(int)(*i)[0]].sum_feat_sq * ec->feature_space[(int)(*i)[1]].sum_feat_sq;
    }
    ec->num_features += quadratic_features_num;
    ec->total_sum_feat_sq += quadratic_features_sqr;
  }